

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_CCtx_setCParams(ZSTD_CCtx *cctx,ZSTD_compressionParameters cparams)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  size_t code;
  undefined8 in_stack_00000010;
  ZSTD_CCtx *in_stack_00000018;
  undefined4 in_stack_00000020;
  size_t err_code_7;
  size_t err_code_6;
  size_t err_code_5;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  ZSTD_strategy in_stack_ffffffffffffff98;
  undefined4 uVar2;
  undefined4 uStack_64;
  size_t local_8;
  
  cParams.chainLog = in_stack_ffffffffffffff84;
  cParams.windowLog = in_stack_00000020;
  cParams._8_8_ = &stack0x00000008;
  cParams._16_8_ = in_stack_ffffffffffffff90;
  cParams.strategy = in_stack_ffffffffffffff98;
  local_8 = ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    local_8 = ZSTD_CCtx_setParameter
                        (in_stack_00000018,(ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20),
                         (int)in_stack_00000010);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = ZSTD_CCtx_setParameter
                          (in_stack_00000018,(ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20),
                           (int)in_stack_00000010);
      uVar1 = ERR_isError(local_8);
      if (uVar1 == 0) {
        local_8 = ZSTD_CCtx_setParameter
                            (in_stack_00000018,(ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20),
                             (int)in_stack_00000010);
        uVar1 = ERR_isError(local_8);
        if (uVar1 == 0) {
          local_8 = ZSTD_CCtx_setParameter
                              (in_stack_00000018,(ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20)
                               ,(int)in_stack_00000010);
          uVar1 = ERR_isError(local_8);
          if (uVar1 == 0) {
            local_8 = ZSTD_CCtx_setParameter
                                (in_stack_00000018,
                                 (ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20),
                                 (int)in_stack_00000010);
            uVar1 = ERR_isError(local_8);
            if (uVar1 == 0) {
              code = ZSTD_CCtx_setParameter
                               (in_stack_00000018,
                                (ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20),
                                (int)in_stack_00000010);
              uVar2 = (undefined4)code;
              uStack_64 = (undefined4)(code >> 0x20);
              uVar1 = ERR_isError(code);
              if (uVar1 == 0) {
                local_8 = ZSTD_CCtx_setParameter
                                    (in_stack_00000018,
                                     (ZSTD_cParameter)((ulong)in_stack_00000010 >> 0x20),
                                     (int)in_stack_00000010);
                uVar1 = ERR_isError(local_8);
                if (uVar1 == 0) {
                  local_8 = 0;
                }
              }
              else {
                local_8 = CONCAT44(uStack_64,uVar2);
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_setCParams(ZSTD_CCtx* cctx, ZSTD_compressionParameters cparams)
{
    ZSTD_STATIC_ASSERT(sizeof(cparams) == 7 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setCParams");
    /* only update if all parameters are valid */
    FORWARD_IF_ERROR(ZSTD_checkCParams(cparams), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_windowLog, cparams.windowLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_chainLog, cparams.chainLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_hashLog, cparams.hashLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_searchLog, cparams.searchLog), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_minMatch, cparams.minMatch), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_targetLength, cparams.targetLength), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_strategy, cparams.strategy), "");
    return 0;
}